

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLDriver.cpp
# Opt level: O2

void __thiscall
irr::video::COpenGLDriver::draw2DImage(COpenGLDriver *this,ITexture *texture,u32 layer,bool flip)

{
  bool bVar1;
  undefined8 uVar2;
  undefined8 uStack_90;
  vector3df texcoordData [4];
  vector3df positionData [4];
  
  if ((texture != (ITexture *)0x0) &&
     (bVar1 = COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
              ::STextureCache::set
                        (&(this->CacheHandler->
                          super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                          ).TextureCache,0,texture,EST_ACTIVE_ALWAYS), bVar1)) {
    disableTextures(this,1);
    setRenderStates2DMode(this,false,true,true);
    COpenGLCacheHandler::setMatrixMode(this->CacheHandler,0x1701);
    glLoadIdentity();
    COpenGLCacheHandler::setMatrixMode(this->CacheHandler,0x1700);
    glLoadIdentity();
    this->Transformation3DChanged = true;
    COpenGLCacheHandler::setClientState(this->CacheHandler,true,false,false,true);
    glVertexPointer(2,0x1406,0xc);
    if (texture->Type == ETT_CUBEMAP) {
      uVar2 = 3;
      uStack_90 = 0xc;
    }
    else {
      uVar2 = 2;
      uStack_90 = 8;
    }
    glTexCoordPointer(uVar2,0x1406,uStack_90);
    glDrawElements(6,4,0x1403,&Quad2DIndices);
  }
  return;
}

Assistant:

void COpenGLDriver::draw2DImage(const video::ITexture *texture, u32 layer, bool flip)
{
	if (!texture || !CacheHandler->getTextureCache().set(0, texture))
		return;

	disableTextures(1);

	setRenderStates2DMode(false, true, true);

	CacheHandler->setMatrixMode(GL_PROJECTION);
	glLoadIdentity();
	CacheHandler->setMatrixMode(GL_MODELVIEW);
	glLoadIdentity();

	Transformation3DChanged = true;

	CacheHandler->setClientState(true, false, false, true);

	const core::vector3df positionData[4] = {
			core::vector3df(-1.f, 1.f, 0.f),
			core::vector3df(1.f, 1.f, 0.f),
			core::vector3df(1.f, -1.f, 0.f),
			core::vector3df(-1.f, -1.f, 0.f)};

	glVertexPointer(2, GL_FLOAT, sizeof(core::vector3df), positionData);

	if (texture && texture->getType() == ETT_CUBEMAP) {
		const core::vector3df texcoordCubeData[6][4] = {

				// GL_TEXTURE_CUBE_MAP_POSITIVE_X
				{
						core::vector3df(1.f, 1.f, 1.f),
						core::vector3df(1.f, 1.f, -1.f),
						core::vector3df(1.f, -1.f, -1.f),
						core::vector3df(1.f, -1.f, 1.f)},

				// GL_TEXTURE_CUBE_MAP_NEGATIVE_X
				{
						core::vector3df(-1.f, 1.f, -1.f),
						core::vector3df(-1.f, 1.f, 1.f),
						core::vector3df(-1.f, -1.f, 1.f),
						core::vector3df(-1.f, -1.f, -1.f)},

				// GL_TEXTURE_CUBE_MAP_POSITIVE_Y
				{
						core::vector3df(-1.f, 1.f, -1.f),
						core::vector3df(1.f, 1.f, -1.f),
						core::vector3df(1.f, 1.f, 1.f),
						core::vector3df(-1.f, 1.f, 1.f)},

				// GL_TEXTURE_CUBE_MAP_NEGATIVE_Y
				{
						core::vector3df(-1.f, -1.f, 1.f),
						core::vector3df(-1.f, -1.f, -1.f),
						core::vector3df(1.f, -1.f, -1.f),
						core::vector3df(1.f, -1.f, 1.f)},

				// GL_TEXTURE_CUBE_MAP_POSITIVE_Z
				{
						core::vector3df(-1.f, 1.f, 1.f),
						core::vector3df(-1.f, -1.f, 1.f),
						core::vector3df(1.f, -1.f, 1.f),
						core::vector3df(1.f, 1.f, 1.f)},

				// GL_TEXTURE_CUBE_MAP_NEGATIVE_Z
				{
						core::vector3df(1.f, 1.f, -1.f),
						core::vector3df(-1.f, 1.f, -1.f),
						core::vector3df(-1.f, -1.f, -1.f),
						core::vector3df(1.f, -1.f, -1.f)}};

		const core::vector3df texcoordData[4] = {
				texcoordCubeData[layer][(flip) ? 3 : 0],
				texcoordCubeData[layer][(flip) ? 2 : 1],
				texcoordCubeData[layer][(flip) ? 1 : 2],
				texcoordCubeData[layer][(flip) ? 0 : 3]};

		glTexCoordPointer(3, GL_FLOAT, sizeof(core::vector3df), texcoordData);
	} else {
		f32 modificator = (flip) ? 1.f : 0.f;

		core::vector2df texcoordData[4] = {
				core::vector2df(0.f, 0.f + modificator),
				core::vector2df(1.f, 0.f + modificator),
				core::vector2df(1.f, 1.f - modificator),
				core::vector2df(0.f, 1.f - modificator)};

		glTexCoordPointer(2, GL_FLOAT, sizeof(core::vector2df), texcoordData);
	}

	glDrawElements(GL_TRIANGLE_FAN, 4, GL_UNSIGNED_SHORT, Quad2DIndices);
}